

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall cmDocumentation::PrintHelpOneCommand(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  cmDocumentation *this_00;
  string cname;
  undefined1 local_58 [32];
  string local_38;
  
  this_00 = (cmDocumentation *)local_58;
  cmsys::SystemTools::LowerCase(&local_38,&this->CurrentArgument);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 "command/",&local_38);
  bVar1 = PrintFiles(this_00,os,(string *)local_58);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Argument \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->CurrentArgument)._M_dataplus._M_p,
                        (this->CurrentArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"\" to --help-command is not a CMake command.  ",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Use --help-command-list to see all commands.\n",0x2d);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneCommand(std::ostream& os)
{
  std::string cname = cmSystemTools::LowerCase(this->CurrentArgument);
  if(this->PrintFiles(os, "command/" + cname))
    {
    return true;
    }
  // Argument was not a command.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-command is not a CMake command.  "
     << "Use --help-command-list to see all commands.\n";
  return false;
}